

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O2

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CCallExpression::Copy(CCallExpression *this)

{
  _func_int **pp_Var1;
  pointer *__ptr;
  CExpression local_28;
  _Alloc_hider local_20;
  
  pp_Var1 = (_func_int **)operator_new(0x18);
  CNameExpression::CopyCast((CNameExpression *)&local_28);
  CExpressionList::Copy((CExpressionList *)&local_20);
  *pp_Var1 = (_func_int *)&PTR_Accept_0017b2f0;
  ((IExpression *)(pp_Var1 + 1))->super_INode =
       (INode)local_28.super_IExpression.super_INode._vptr_INode;
  pp_Var1[2] = (_func_int *)local_20._M_p;
  (this->super_CExpression).super_IExpression.super_INode._vptr_INode = pp_Var1;
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CCallExpression::Copy( ) const {
    return std::move(
            std::unique_ptr<const IRT::CExpression>( new CCallExpression( function->CopyCast( ), arguments->Copy( ))));
}